

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O3

void __thiscall
arangodb::velocypack::HexDump::HexDump
          (HexDump *this,Slice slice,int valuesPerLine,string *separator,string *header)

{
  pointer pcVar1;
  ulong uVar2;
  uint8_t *local_38;
  
  this->data = slice._start;
  uVar2 = (ulong)"\x01\x01"[*slice._start];
  local_38 = slice._start;
  if (uVar2 == 0) {
    uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_38,slice._start);
  }
  this->length = uVar2;
  this->valuesPerLine = valuesPerLine;
  (this->separator)._M_dataplus._M_p = (pointer)&(this->separator).field_2;
  pcVar1 = (separator->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->separator,pcVar1,pcVar1 + separator->_M_string_length);
  (this->header)._M_dataplus._M_p = (pointer)&(this->header).field_2;
  pcVar1 = (header->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->header,pcVar1,pcVar1 + header->_M_string_length);
  return;
}

Assistant:

HexDump(Slice slice, int valuesPerLine = 16,
          std::string const& separator = " ", std::string const& header = "0x")
      : data(slice.start()),
        length(slice.byteSize()),
        valuesPerLine(valuesPerLine),
        separator(separator),
        header(header) {}